

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall
fasttext::FastText::cbow
          (FastText *this,State *state,real lr,vector<int,_std::allocator<int>_> *line)

{
  result_type_conflict1 rVar1;
  size_type sVar2;
  vector<int,_std::allocator<int>_> *in_RDX;
  State *in_RDI;
  vector<int,_std::allocator<int>_> *ngrams;
  int32_t c;
  int32_t boundary;
  int32_t w;
  uniform_int_distribution<int> uniform;
  vector<int,_std::allocator<int>_> bow;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff38;
  int32_t i;
  iterator in_stack_ffffffffffffff40;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff50;
  iterator in_stack_ffffffffffffff78;
  const_iterator in_stack_ffffffffffffff80;
  const_iterator in_stack_ffffffffffffff88;
  iterator in_stack_ffffffffffffff90;
  const_iterator in_stack_ffffffffffffff98;
  int local_58;
  int local_50;
  vector<int,_std::allocator<int>_> local_38;
  vector<int,_std::allocator<int>_> *local_20;
  
  local_20 = in_RDX;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x170f02);
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x170f0c);
  std::uniform_int_distribution<int>::uniform_int_distribution
            ((uniform_int_distribution<int> *)in_stack_ffffffffffffff40._M_current,
             (int)((ulong)in_stack_ffffffffffffff38 >> 0x20),(int)in_stack_ffffffffffffff38);
  local_50 = 0;
  while( true ) {
    sVar2 = std::vector<int,_std::allocator<int>_>::size(local_20);
    if (sVar2 <= (ulong)(long)local_50) break;
    rVar1 = std::uniform_int_distribution<int>::operator()
                      ((uniform_int_distribution<int> *)in_stack_ffffffffffffff40._M_current,
                       (linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *)
                       in_stack_ffffffffffffff38);
    std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x170f87);
    for (local_58 = -rVar1; local_58 <= rVar1; local_58 = local_58 + 1) {
      if ((local_58 != 0) && (-1 < local_50 + local_58)) {
        sVar2 = std::vector<int,_std::allocator<int>_>::size(local_20);
        if ((ulong)(long)(local_50 + local_58) < sVar2) {
          std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x170ff6);
          i = (int32_t)((ulong)in_stack_ffffffffffffff38 >> 0x20);
          std::vector<int,_std::allocator<int>_>::operator[](local_20,(long)(local_50 + local_58));
          in_stack_ffffffffffffff50 =
               Dictionary::getSubwords((Dictionary *)in_stack_ffffffffffffff40._M_current,i);
          in_stack_ffffffffffffff38 = &local_38;
          in_stack_ffffffffffffff90 =
               std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff38);
          __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
          __normal_iterator<int*>
                    ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     in_stack_ffffffffffffff40._M_current,
                     (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     in_stack_ffffffffffffff38);
          in_stack_ffffffffffffff88 =
               std::vector<int,_std::allocator<int>_>::cbegin(in_stack_ffffffffffffff38);
          in_stack_ffffffffffffff80 =
               std::vector<int,_std::allocator<int>_>::cend(in_stack_ffffffffffffff38);
          in_stack_ffffffffffffff40 =
               std::vector<int,std::allocator<int>>::
               insert<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,void>
                         (in_stack_ffffffffffffff80._M_current,in_stack_ffffffffffffff98,
                          in_stack_ffffffffffffff90._M_current,in_stack_ffffffffffffff88._M_current)
          ;
          in_stack_ffffffffffffff78 = in_stack_ffffffffffffff40;
        }
      }
    }
    std::__shared_ptr_access<fasttext::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1710e0);
    Model::update((Model *)in_stack_ffffffffffffff90._M_current,
                  (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff88._M_current,
                  (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff80._M_current,
                  (int32_t)((ulong)in_stack_ffffffffffffff78._M_current >> 0x20),
                  SUB84(in_stack_ffffffffffffff78._M_current,0),in_RDI);
    local_50 = local_50 + 1;
  }
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffff50);
  return;
}

Assistant:

void FastText::cbow(
    Model::State& state,
    real lr,
    const std::vector<int32_t>& line) {
  std::vector<int32_t> bow;
  std::uniform_int_distribution<> uniform(1, args_->ws);
  for (int32_t w = 0; w < line.size(); w++) {
    int32_t boundary = uniform(state.rng);
    bow.clear();
    for (int32_t c = -boundary; c <= boundary; c++) {
      if (c != 0 && w + c >= 0 && w + c < line.size()) {
        const std::vector<int32_t>& ngrams = dict_->getSubwords(line[w + c]);
        bow.insert(bow.end(), ngrams.cbegin(), ngrams.cend());
      }
    }
    model_->update(bow, line, w, lr, state);
  }
}